

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3db66::BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture
          (BasicLoggerThreadNameFixture *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  not_null<const_char_*> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BasicLoggerThreadNameFixture_00269738;
  local_18.ptr_ = (this->old_name_)._M_dataplus._M_p;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_18);
  pstore::threads::set_name(local_18);
  pcVar2 = (this->old_name_)._M_dataplus._M_p;
  paVar1 = &(this->old_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture () {
        pstore::no_ex_escape ([this] () { pstore::threads::set_name (old_name_.c_str ()); });
    }